

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getNextLeak
          (MemoryLeakDetectorTable *this,MemoryLeakDetectorNode *leak,MemLeakPeriod period)

{
  char *pcVar1;
  MemoryLeakDetectorNode *pMVar2;
  MemoryLeakDetectorList *this_00;
  char *pcVar3;
  
  pMVar2 = MemoryLeakDetectorList::getNextLeak(this->table_,leak,period);
  if (pMVar2 == (MemoryLeakDetectorNode *)0x0) {
    pcVar1 = leak->memory_;
    pcVar3 = pcVar1 + ~(((ulong)pcVar1 / 0x49) * 0x49);
    this_00 = this[-((ulong)pcVar1 / 0x49)].table_ + (long)pcVar1;
    do {
      this_00 = this_00 + 1;
      pcVar3 = pcVar3 + 1;
      if ((char *)0x47 < pcVar3) {
        return (MemoryLeakDetectorNode *)0x0;
      }
      pMVar2 = MemoryLeakDetectorList::getFirstLeak(this_00,period);
    } while (pMVar2 == (MemoryLeakDetectorNode *)0x0);
  }
  return pMVar2;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getNextLeak(MemoryLeakDetectorNode* leak, MemLeakPeriod period)
{
    unsigned long i = hash(leak->memory_);
    MemoryLeakDetectorNode* node = table_[i].getNextLeak(leak, period);
    if (node) return node;

    for (++i; i < hash_prime; i++) {
        node = table_[i].getFirstLeak(period);
        if (node) return node;
    }
    return NULLPTR;
}